

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.hpp
# Opt level: O2

char * jessilib::impl::suffix_helper(char *begin,char *end,char *ignored_suffix)

{
  char *pcVar1;
  
  for (; (pcVar1 = end, begin != end && (pcVar1 = begin, *begin == *ignored_suffix));
      begin = begin + 1) {
    ignored_suffix = ignored_suffix + 1;
  }
  return pcVar1;
}

Assistant:

constexpr const char* suffix_helper(const char* begin, const char* end, const char* ignored_suffix) {
	while (begin != end
		&& *begin == *ignored_suffix) {
		++begin;
		++ignored_suffix;
	}

	return begin;
}